

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O3

void RDL_addRCFtoURF(uint RCFIdx,uint URFIdx,uint previouslyAlloced,RDL_cfam ***URFs,RDL_cfURF *CFs)

{
  RDL_cfam **ppRVar1;
  
  if (previouslyAlloced == 0) {
    ppRVar1 = (RDL_cfam **)malloc(8);
    URFs[URFIdx] = ppRVar1;
  }
  else {
    ppRVar1 = (RDL_cfam **)realloc(URFs[URFIdx],(ulong)(previouslyAlloced + 1) << 3);
    URFs[URFIdx] = ppRVar1;
  }
  ppRVar1[previouslyAlloced] = CFs->fams[RCFIdx];
  return;
}

Assistant:

void RDL_addRCFtoURF(unsigned RCFIdx, unsigned URFIdx, unsigned previouslyAlloced,
                     RDL_cfam ***URFs, RDL_cfURF *CFs)
{
  if(previouslyAlloced == 0)
  {
    URFs[URFIdx] = malloc((previouslyAlloced+1) * sizeof(*URFs[URFIdx]));
  }
  else
  {
    URFs[URFIdx] = realloc(URFs[URFIdx], (previouslyAlloced+1) *
                           sizeof(*URFs[URFIdx]));
  }
  URFs[URFIdx][previouslyAlloced] =  CFs->fams[RCFIdx];
}